

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ranges.h
# Opt level: O3

void __thiscall
fmt::v11::detail::format_tuple_element<fmt::v11::context>::operator()
          (format_tuple_element<fmt::v11::context> *this,formatter<int,_char,_void> *f,int *v)

{
  char *begin;
  
  if (0 < this->i) {
    begin = (this->separator).data_;
    buffer<char>::append<char>((this->ctx->out_).container,begin,begin + (this->separator).size_);
  }
  native_formatter<int,_char,_(fmt::v11::detail::type)1>::format<fmt::v11::context>
            (&f->super_native_formatter<int,_char,_(fmt::v11::detail::type)1>,v,this->ctx);
  this->i = this->i + 1;
  return;
}

Assistant:

void operator()(const formatter<T, char_type>& f, const T& v) {
    if (i > 0) ctx.advance_to(detail::copy<char_type>(separator, ctx.out()));
    ctx.advance_to(f.format(v, ctx));
    ++i;
  }